

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred.c
# Opt level: O1

void aom_paeth_predictor_4x4_c(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  byte bVar8;
  uint uVar9;
  
  bVar1 = above[-1];
  lVar6 = 0;
  do {
    lVar7 = 0;
    do {
      bVar2 = above[lVar7];
      uVar4 = (uint)left[lVar6] - (uint)bVar1;
      uVar9 = (uint)bVar2 - (uint)bVar1;
      uVar3 = -uVar9;
      if (0 < (int)uVar9) {
        uVar3 = uVar9;
      }
      uVar9 = -uVar4;
      if (0 < (int)uVar4) {
        uVar9 = uVar4;
      }
      uVar5 = (uVar4 + bVar2) - (uint)bVar1;
      uVar4 = -uVar5;
      if (0 < (int)uVar5) {
        uVar4 = uVar5;
      }
      if (uVar4 < uVar9) {
        bVar2 = bVar1;
      }
      bVar8 = left[lVar6];
      if (uVar4 < uVar3) {
        bVar8 = bVar2;
      }
      if (uVar9 < uVar3) {
        bVar8 = bVar2;
      }
      dst[lVar7] = bVar8;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 4);
    dst = dst + stride;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 4);
  return;
}

Assistant:

static inline void paeth_predictor(uint8_t *dst, ptrdiff_t stride, int bw,
                                   int bh, const uint8_t *above,
                                   const uint8_t *left) {
  int r, c;
  const uint8_t ytop_left = above[-1];

  for (r = 0; r < bh; r++) {
    for (c = 0; c < bw; c++)
      dst[c] = (uint8_t)paeth_predictor_single(left[r], above[c], ytop_left);
    dst += stride;
  }
}